

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_fwd_fload(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  TRef TVar5;
  IRRef1 *pIVar6;
  ushort uVar7;
  
  uVar1 = (J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  pIVar6 = J->chain + 0x4d;
  while (uVar7 = *pIVar6, uVar1 < uVar7) {
    pIVar3 = (J->cur).ir;
    AVar4 = aa_fref(J,&(J->fold).ins,pIVar3 + pIVar3[uVar7].field_0.op1);
    if (AVar4 == ALIAS_MAY) goto LAB_0011ad57;
    if (AVar4 == ALIAS_MUST) {
      return (TRef)(&pIVar3->field_0)[uVar7].op2;
    }
    pIVar6 = &(&pIVar3->field_0)[uVar7].prev;
  }
  uVar7 = uVar1;
  if ((IVar2 == 5) && ((byte)(*(char *)((long)(J->cur).ir + (ulong)uVar1 * 8 + 5) + 0xafU) < 2)) {
    TVar5 = lj_ir_knull(J,IRT_TAB);
    return TVar5;
  }
LAB_0011ad57:
  TVar5 = lj_opt_cselim(J,(uint)uVar7);
  return TVar5;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_fload(jit_State *J)
{
  IRRef oref = fins->op1;  /* Object reference. */
  IRRef fid = fins->op2;  /* Field ID. */
  IRRef lim = oref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_FSTORE];
  while (ref > oref) {
    IRIns *store = IR(ref);
    switch (aa_fref(J, fins, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store: const-fold field loads from allocations. */
  if (fid == IRFL_TAB_META) {
    IRIns *ir = IR(oref);
    if (ir->o == IR_TNEW || ir->o == IR_TDUP)
      return lj_ir_knull(J, IRT_TAB);
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  return lj_opt_cselim(J, lim);
}